

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::~AnnotatedEnumHandler(AnnotatedEnumHandler *this)

{
  HashBucket *pHVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Entry *pEVar4;
  RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *pRVar5;
  Entry *pEVar6;
  StringPtr *pSVar7;
  
  pHVar1 = (this->nameToValue).table.indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->nameToValue).table.indexes.buckets.size_;
    (this->nameToValue).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->nameToValue).table.indexes.buckets.size_ = 0;
    pAVar3 = (this->nameToValue).table.indexes.buckets.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pEVar4 = (this->nameToValue).table.rows.builder.ptr;
  if (pEVar4 != (Entry *)0x0) {
    pRVar5 = (this->nameToValue).table.rows.builder.pos;
    pEVar6 = (this->nameToValue).table.rows.builder.endPtr;
    (this->nameToValue).table.rows.builder.ptr = (Entry *)0x0;
    (this->nameToValue).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *)0x0;
    (this->nameToValue).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar3 = (this->nameToValue).table.rows.builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pEVar4,0x18,((long)pRVar5 - (long)pEVar4 >> 3) * -0x5555555555555555,
               ((long)pEVar6 - (long)pEVar4 >> 3) * -0x5555555555555555,0);
  }
  pSVar7 = (this->valueToName).ptr;
  if (pSVar7 != (StringPtr *)0x0) {
    sVar2 = (this->valueToName).size_;
    (this->valueToName).ptr = (StringPtr *)0x0;
    (this->valueToName).size_ = 0;
    pAVar3 = (this->valueToName).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pSVar7,0x10,sVar2,sVar2,0);
  }
  return;
}

Assistant:

class JsonCodec::AnnotatedEnumHandler final: public JsonCodec::Handler<DynamicEnum> {
public:
  AnnotatedEnumHandler(EnumSchema schema): schema(schema) {
    auto enumerants = schema.getEnumerants();
    auto builder = kj::heapArrayBuilder<kj::StringPtr>(enumerants.size());

    for (auto e: enumerants) {
      auto proto = e.getProto();
      kj::StringPtr name = proto.getName();

      for (auto anno: proto.getAnnotations()) {
        switch (anno.getId()) {
          case JSON_NAME_ANNOTATION_ID:
            name = anno.getValue().getText();
            break;
        }
      }

      builder.add(name);
      nameToValue.insert(name, e.getIndex());
    }

    valueToName = builder.finish();
  }

  void encode(const JsonCodec& codec, DynamicEnum input, JsonValue::Builder output) const override {
    KJ_IF_SOME(e, input.getEnumerant()) {
      KJ_ASSERT(e.getIndex() < valueToName.size());
      output.setString(valueToName[e.getIndex()]);
    } else {
      output.setNumber(input.getRaw());
    }
  }

  DynamicEnum decode(const JsonCodec& codec, JsonValue::Reader input) const override {
    if (input.isNumber()) {
      return DynamicEnum(schema, static_cast<uint16_t>(input.getNumber()));
    } else {
      uint16_t val = KJ_REQUIRE_NONNULL(nameToValue.find(input.getString()),
          "invalid enum value", input.getString());
      return DynamicEnum(schema.getEnumerants()[val]);
    }
  }